

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest_DebugStringReservedRangeMax_Test::
TestBody(ValidationErrorTest_DebugStringReservedRangeMax_Test *this)

{
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *buffer;
  Nonnull<char_*> pcVar1;
  FileDescriptor *this_00;
  pointer message;
  size_t in_R9;
  string_view file_text;
  string_view format;
  string result;
  char *local_c8;
  size_t local_c0;
  char local_b8;
  undefined7 uStack_b7;
  undefined1 local_a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98 [2];
  long local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_40;
  long local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  
  buffer = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (local_a8 + 0x10);
  pcVar1 = absl::lts_20250127::numbers_internal::FastIntToBuffer(0x7fffffff,(Nonnull<char_*>)buffer)
  ;
  local_a8._0_8_ = (long)pcVar1 - (long)buffer;
  local_a8._8_8_ = buffer;
  pcVar1 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                     (0x20000000,(Nonnull<char_*>)&local_68);
  local_78 = (long)pcVar1 - (long)&local_68;
  local_c0 = 0;
  local_b8 = '\0';
  local_48._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )local_a8._0_8_;
  pbStack_40 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
               local_a8._8_8_;
  format._M_str = (char *)&local_48;
  format._M_len =
       (size_t)
       "name: \"foo.proto\" enum_type {   name: \"Bar\"  value { name:\"BAR\" number:1 }  reserved_range { start: 5 end: $0 }}message_type {  name: \"Foo\"  reserved_range { start: 5 end: $1 }}"
  ;
  local_c8 = &local_b8;
  local_70 = &local_68;
  local_38 = local_78;
  local_30 = &local_68;
  absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
            ((substitute_internal *)&local_c8,(Nonnull<std::string_*>)0xb1,format,
             (Nullable<const_absl::string_view_*>)0x2,in_R9);
  file_text._M_str = local_c8;
  file_text._M_len = local_c0;
  this_00 = ValidationErrorTest::BuildFile(&this->super_ValidationErrorTest,file_text);
  if (local_c8 != &local_b8) {
    operator_delete(local_c8,CONCAT71(uStack_b7,local_b8) + 1);
  }
  FileDescriptor::DebugString_abi_cxx11_((string *)local_a8,this_00);
  testing::internal::CmpHelperEQ<char[105],std::__cxx11::string>
            ((internal *)&local_78,
             "\"syntax = \\\"proto2\\\";\\n\\n\" \"enum Bar {\\n\" \"  BAR = 1;\\n\" \"  reserved 5 to max;\\n\" \"}\\n\\n\" \"message Foo {\\n\" \"  reserved 5 to max;\\n\" \"}\\n\\n\""
             ,"file->DebugString()",
             (char (*) [105])
             "syntax = \"proto2\";\n\nenum Bar {\n  BAR = 1;\n  reserved 5 to max;\n}\n\nmessage Foo {\n  reserved 5 to max;\n}\n\n"
             ,(string *)local_a8);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8._0_8_ !=
      buffer) {
    operator_delete((void *)local_a8._0_8_,local_98[0]._M_allocated_capacity + 1);
  }
  if (local_78._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_a8);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = anon_var_dwarf_a22956 + 5;
    }
    else {
      message = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x13be,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_a8._0_8_ + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  return;
}

Assistant:

TEST_F(ValidationErrorTest, DebugStringReservedRangeMax) {
  const FileDescriptor* file = BuildFile(absl::Substitute(
      "name: \"foo.proto\" "
      "enum_type { "
      "  name: \"Bar\""
      "  value { name:\"BAR\" number:1 }"
      "  reserved_range { start: 5 end: $0 }"
      "}"
      "message_type {"
      "  name: \"Foo\""
      "  reserved_range { start: 5 end: $1 }"
      "}",
      std::numeric_limits<int>::max(), FieldDescriptor::kMaxNumber + 1));

  ASSERT_EQ(
      "syntax = \"proto2\";\n\n"
      "enum Bar {\n"
      "  BAR = 1;\n"
      "  reserved 5 to max;\n"
      "}\n\n"
      "message Foo {\n"
      "  reserved 5 to max;\n"
      "}\n\n",
      file->DebugString());
}